

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O0

void __thiscall PolynomialFDS::display(PolynomialFDS *this,ostream *o)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_01;
  string local_40;
  int local_1c;
  ostream *poStack_18;
  int i;
  ostream *o_local;
  PolynomialFDS *this_local;
  
  poStack_18 = o;
  o_local = (ostream *)this;
  poVar2 = std::operator<<(o,"PolynomialFDS numstates=");
  iVar1 = numStates(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," numvars=");
  iVar1 = numVariables(this);
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    uVar3 = (ulong)local_1c;
    sVar4 = std::vector<Polynomial,_std::allocator<Polynomial>_>::size(&this->mPolynomials);
    if (sVar4 <= uVar3) break;
    poVar2 = std::operator<<(poStack_18,"  ");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->mVariableNames,(long)local_1c);
    poVar2 = std::operator<<(poVar2,(string *)pvVar5);
    poVar2 = std::operator<<(poVar2," = ");
    this_01 = std::vector<Polynomial,_std::allocator<Polynomial>_>::operator[]
                        (&this->mPolynomials,(long)local_1c);
    Polynomial::evaluateSymbolic(&local_40,this_01,&this->mVariableNames);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void PolynomialFDS::display(std::ostream& o)
{
  o << "PolynomialFDS numstates=" << numStates()
    << " numvars=" << numVariables()
    << std::endl;
  for (int i=0; i < mPolynomials.size(); i++)
    o << "  " << mVariableNames[i] << " = " << mPolynomials[i].evaluateSymbolic(mVariableNames) << std::endl;
}